

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::clear_value
          (CustomModel_CustomModelParamValue *this)

{
  ValueCase VVar1;
  Arena *pAVar2;
  CustomModel_CustomModelParamValue *this_local;
  
  VVar1 = value_case(this);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    break;
  case kStringValue:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&this->value_,pAVar2);
    break;
  case kIntValue:
    break;
  case kLongValue:
    break;
  case kBoolValue:
    break;
  case kBytesValue:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&this->value_,pAVar2);
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  switch (value_case()) {
    case kDoubleValue: {
      // No need to clear
      break;
    }
    case kStringValue: {
      value_.stringvalue_.Destroy(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, GetArenaForAllocation());
      break;
    }
    case kIntValue: {
      // No need to clear
      break;
    }
    case kLongValue: {
      // No need to clear
      break;
    }
    case kBoolValue: {
      // No need to clear
      break;
    }
    case kBytesValue: {
      value_.bytesvalue_.Destroy(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, GetArenaForAllocation());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}